

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConstraintBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintBlockSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConstraintItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ConstraintItemSyntax> *args_1,
          Token *args_2)

{
  Token closeBrace;
  Token openBrace;
  ConstraintBlockSyntax *pCVar1;
  ConstraintBlockSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pCVar1 = (ConstraintBlockSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  openBrace.info = unaff_retaddr;
  openBrace.kind = (short)in_RDI;
  openBrace._2_1_ = (char)((ulong)in_RDI >> 0x10);
  openBrace.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  openBrace.rawLen = (int)((ulong)in_RDI >> 0x20);
  closeBrace.info = in_RSI;
  closeBrace.kind = (short)in_RDX;
  closeBrace._2_1_ = (char)((ulong)in_RDX >> 0x10);
  closeBrace.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  closeBrace.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::ConstraintBlockSyntax::ConstraintBlockSyntax
            (in_RCX,openBrace,(SyntaxList<slang::syntax::ConstraintItemSyntax> *)in_RSI->location,
             closeBrace);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }